

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O1

string * demangle_abi_cxx11_(string *__return_storage_ptr__,char *mangled_name)

{
  char *__ptr;
  int status;
  size_t len;
  allocator local_1d;
  undefined4 local_1c;
  undefined8 local_18;
  
  local_18 = 0;
  local_1c = 0;
  __ptr = (char *)__cxa_demangle(mangled_name,0);
  std::__cxx11::string::string((string *)__return_storage_ptr__,__ptr,&local_1d);
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string demangle(const char* mangled_name) {
  std::size_t len = 0;
  int status = 0;
  std::unique_ptr<char, decltype(&std::free)> ptr(
      __cxxabiv1::__cxa_demangle(mangled_name, nullptr, &len, &status),
      &std::free);
  return ptr.get();
}